

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix4 * matrix4_make_transformation_rotationf_x(matrix4 *m,float angle)

{
  double dVar1;
  double dVar2;
  
  dVar1 = cos((double)angle);
  dVar2 = sin((double)angle);
  (m->field_0).m[0] = 1.0;
  *(undefined8 *)((long)&m->field_0 + 4) = 0;
  *(undefined8 *)((long)&m->field_0 + 0xc) = 0;
  *(undefined8 *)((long)&m->field_0 + 0x18) = 0;
  *(undefined8 *)((long)&m->field_0 + 0x20) = 0;
  *(undefined8 *)((long)&m->field_0 + 0x2c) = 0;
  *(undefined8 *)((long)&m->field_0 + 0x34) = 0;
  (m->field_0).m[0xf] = 1.0;
  (m->field_0).m[5] = (float)dVar1;
  (m->field_0).m[6] = (float)dVar2;
  (m->field_0).m[9] = -(float)dVar2;
  (m->field_0).m[10] = (float)dVar1;
  return m;
}

Assistant:

HYPAPI struct matrix4 *matrix4_make_transformation_rotationf_x(struct matrix4 *m, HYP_FLOAT angle)
{
	HYP_FLOAT c = HYP_COS(angle);
	HYP_FLOAT s = HYP_SIN(angle);

	matrix4_identity(m);

	m->r11 = c;
	m->r12 = s;
	m->r21 = -s;
	m->r22 = c;

	return m;
}